

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *fileConfig,string *outputDir,
          string *output)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar3;
  cmGeneratorTarget *pcVar4;
  pointer pcVar5;
  size_t sVar6;
  cmLocalNinjaGenerator *pcVar7;
  cmLocalNinjaGenerator *this_00;
  cmMakefile *this_01;
  size_type sVar8;
  bool bVar9;
  int iVar10;
  TargetType TVar11;
  int iVar12;
  cmGlobalNinjaGenerator *gg;
  cmGlobalNinjaGenerator *pcVar13;
  string *psVar14;
  char *pcVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  char *__s;
  size_t sVar18;
  mapped_type *pmVar19;
  cmGeneratedFileStream *os;
  size_type sVar20;
  bool bVar21;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  bool usedResponseFile;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_490;
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  size_type local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_460;
  string *local_458;
  undefined8 local_450;
  char *local_448;
  undefined8 local_440;
  undefined1 local_438 [32];
  pointer local_418;
  undefined8 local_410;
  cmGeneratorTarget *local_408;
  string *local_400;
  string objPath;
  string local_3d8;
  string targetOutputImplib;
  Names tgtNames;
  string langFlags;
  string linkPath;
  string frameworkPath;
  string local_238;
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  string local_1d0;
  cmNinjaBuild build;
  string local_90;
  string local_70;
  string createRule;
  
  pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  local_400 = output;
  gg = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetFullPath(&build.Comment,pcVar4,config,ImportLibraryArtifact,false);
  pcVar13 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar14 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar13,&build.Comment);
  targetOutputImplib._M_dataplus._M_p = (pointer)&targetOutputImplib.field_2;
  pcVar5 = (psVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&targetOutputImplib,pcVar5,pcVar5 + psVar14->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)build.Comment._M_dataplus._M_p != &build.Comment.field_2) {
    operator_delete(build.Comment._M_dataplus._M_p,build.Comment.field_2._M_allocated_capacity + 1);
  }
  sVar6 = config->_M_string_length;
  local_408 = pcVar4;
  if (sVar6 == fileConfig->_M_string_length) {
    if (sVar6 != 0) {
      iVar10 = bcmp((config->_M_dataplus)._M_p,(fileConfig->_M_dataplus)._M_p,sVar6);
      if (iVar10 != 0) goto LAB_00515c87;
    }
  }
  else {
LAB_00515c87:
    pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    (*(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[0x10])(&usedResponseFile,pcVar7,pcVar4);
    (*(gg->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
              (&linkLineComputer,gg,fileConfig);
    build.Comment._M_dataplus._M_p = (pointer)pcStack_490;
    build.Comment._M_string_length = (size_type)_usedResponseFile;
    build.Comment.field_2._8_8_ =
         linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
         DirectoryState.Tree;
    build.Rule._M_dataplus._M_p =
         (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                  _vptr_cmLinkLineComputer;
    build.Rule.field_2._M_allocated_capacity = 1;
    build.Rule.field_2._8_8_ =
         (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
    build.Outputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    views._M_len = 3;
    views._M_array = (iterator)&build;
    build.Comment.field_2._M_allocated_capacity = (size_type)&usedResponseFile;
    build.Rule._M_string_length = (size_type)&linkLineComputer;
    cmCatViews(&tgtNames.Base,views);
    pcVar4 = local_408;
    if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
        _vptr_cmLinkLineComputer !=
        (_func_int **)
        &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
         DirectoryState.Position) {
      operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      _vptr_cmLinkLineComputer,
                      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      StateDir.DirectoryState.Position + 1);
    }
    if ((pointer)_usedResponseFile != (pointer)local_488) {
      operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
    }
    (*(gg->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x18])
              (&build,gg,outputDir,fileConfig);
    std::__cxx11::string::operator=((string *)&tgtNames,(string *)&build);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)build.Comment._M_dataplus._M_p != &build.Comment.field_2) {
      operator_delete(build.Comment._M_dataplus._M_p,build.Comment.field_2._M_allocated_capacity + 1
                     );
    }
    sVar6 = outputDir->_M_string_length;
    if (sVar6 == tgtNames.Base._M_string_length) {
      if (sVar6 != 0) {
        iVar10 = bcmp((outputDir->_M_dataplus)._M_p,tgtNames.Base._M_dataplus._M_p,sVar6);
        if (iVar10 != 0) goto LAB_00515ded;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
        operator_delete(tgtNames.Base._M_dataplus._M_p,
                        tgtNames.Base.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00516f3d;
    }
LAB_00515ded:
    cmGeneratorTarget::GetFullName(&build.Comment,pcVar4,config,ImportLibraryArtifact);
    sVar8 = build.Comment._M_string_length;
    bVar21 = true;
    if (build.Comment._M_string_length == 0) {
LAB_00515e9d:
      bVar9 = false;
    }
    else {
      cmGeneratorTarget::GetFullName(&local_70,pcVar4,fileConfig,ImportLibraryArtifact);
      if (local_70._M_string_length == 0) goto LAB_00515e9d;
      cmGeneratorTarget::GetFullPath(&local_90,pcVar4,fileConfig,ImportLibraryArtifact,false);
      pcVar13 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      psVar14 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar13,&local_90);
      bVar9 = true;
      if (targetOutputImplib._M_string_length == psVar14->_M_string_length) {
        if (targetOutputImplib._M_string_length == 0) {
          bVar21 = false;
        }
        else {
          iVar10 = bcmp(targetOutputImplib._M_dataplus._M_p,(psVar14->_M_dataplus)._M_p,
                        targetOutputImplib._M_string_length);
          bVar21 = iVar10 != 0;
        }
      }
      else {
        bVar21 = true;
      }
    }
    if ((bVar9) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2)) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((sVar8 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2)) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)build.Comment._M_dataplus._M_p != &build.Comment.field_2) {
      operator_delete(build.Comment._M_dataplus._M_p,build.Comment.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
      operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1
                     );
    }
    if (!bVar21) goto LAB_00516f3d;
  }
  LanguageLinkerDeviceRule(&local_1d0,this,config);
  build.Rule._M_dataplus._M_p = (pointer)&build.Rule.field_2;
  build.Comment._M_string_length = 0;
  build.Comment.field_2._M_allocated_capacity =
       build.Comment.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) {
    build.Rule.field_2._8_8_ = local_1d0.field_2._8_8_;
  }
  else {
    build.Rule._M_dataplus._M_p = local_1d0._M_dataplus._M_p;
  }
  build.Rule.field_2._M_allocated_capacity._1_7_ = local_1d0.field_2._M_allocated_capacity._1_7_;
  build.Rule.field_2._M_local_buf[0] = local_1d0.field_2._M_local_buf[0];
  build.Rule._M_string_length = local_1d0._M_string_length;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  p_Var1 = &build.Variables._M_t._M_impl.super__Rb_tree_header;
  build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  build.Comment._M_dataplus._M_p = (pointer)&build.Comment.field_2;
  memset(&build.Outputs,0,0x90);
  build.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  build.RspFile._M_dataplus._M_p = (pointer)&build.RspFile.field_2;
  build.RspFile._M_string_length = 0;
  build.RspFile.field_2._M_local_buf[0] = '\0';
  build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pcVar15 = GetVisibleTypeName(this);
  tgtNames.Base._M_dataplus._M_p = (pointer)0x9;
  tgtNames.Base._M_string_length = (size_type)anon_var_dwarf_1f4f6c2;
  tgtNames.Base.field_2._M_allocated_capacity = 0;
  tgtNames.Base.field_2._8_8_ = strlen(pcVar15);
  tgtNames.Output._M_string_length = 0;
  local_488._0_8_ = local_488 + 8;
  _usedResponseFile = (pointer)0x0;
  pcStack_490 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)&DAT_00000001;
  local_488[8] = 0x20;
  tgtNames.Output.field_2._M_allocated_capacity = 1;
  tgtNames.Real._M_dataplus._M_p = (pointer)0x0;
  tgtNames.Real.field_2._M_allocated_capacity = (size_type)(local_400->_M_dataplus)._M_p;
  tgtNames.Real._M_string_length = local_400->_M_string_length;
  tgtNames.Real.field_2._8_8_ = 0;
  views_00._M_len = 4;
  views_00._M_array = (iterator)&tgtNames;
  tgtNames.Output._M_dataplus._M_p = pcVar15;
  tgtNames.Output.field_2._8_8_ = local_488._0_8_;
  cmCatViews((string *)&linkLineComputer,views_00);
  std::__cxx11::string::operator=((string *)&build,(string *)&linkLineComputer);
  pcVar4 = local_408;
  if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer !=
      (_func_int **)
      &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
       DirectoryState.Position) {
    operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    _vptr_cmLinkLineComputer,
                    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    StateDir.DirectoryState.Position + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&build.Outputs,local_400);
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&usedResponseFile,&this->super_cmNinjaTargetGenerator,config);
  tgtNames.Base.field_2._M_allocated_capacity =
       (size_type)
       build.ExplicitDeps.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  tgtNames.Base._M_string_length =
       (size_type)
       build.ExplicitDeps.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  tgtNames.Base._M_dataplus._M_p =
       (pointer)build.ExplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  build.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_usedResponseFile;
  build.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcStack_490;
  build.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_488._0_8_;
  _usedResponseFile = (pointer)0x0;
  pcStack_490 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_488._0_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tgtNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&usedResponseFile);
  cmGeneratorTarget::GetLinkerLanguage
            (&tgtNames.Base,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            ((cmNinjaDeps *)&linkLineComputer,&this->super_cmNinjaTargetGenerator,&tgtNames.Base,
             config,false);
  local_488._0_8_ =
       build.ImplicitDeps.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcStack_490 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
                build.ImplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  _usedResponseFile =
       (pointer)build.ImplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  build.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                _vptr_cmLinkLineComputer;
  build.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
                DirectoryState.Tree;
  build.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
                DirectoryState.Position;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)0x0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&usedResponseFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  paVar2 = &tgtNames.Base.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  cmGeneratorTarget::GetLinkerLanguage
            (&tgtNames.Base,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,pcVar4,&tgtNames.Base,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  source._M_str = (local_400->_M_dataplus)._M_p;
  source._M_len = local_400->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&tgtNames.Base,(cmOutputConverter *)pcVar7,source,SHELL,false);
  _usedResponseFile = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"TARGET_FILE","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&build.Variables,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar16,(string *)&tgtNames);
  if ((pointer)_usedResponseFile != (pointer)local_488) {
    operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  this_00 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)&usedResponseFile,(cmLocalGenerator *)this_00);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&tgtNames,(cmStateSnapshot *)&usedResponseFile);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (&linkLineComputer,(cmOutputConverter *)this_00,(cmStateDirectory *)&tgtNames,gg);
  iVar10 = (*(gg->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
             [0x28])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)&linkLineComputer,SUB41(iVar10,0));
  tgtNames.Base._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"LINK_LIBRARIES","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&build.Variables,&tgtNames.Base);
  _usedResponseFile = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_FLAGS","");
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&build.Variables,(key_type *)&usedResponseFile);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar7,&linkLineComputer.super_cmLinkLineDeviceComputer,config,
             pmVar16,pmVar17,&frameworkPath,&linkPath,pcVar4);
  if ((pointer)_usedResponseFile != (pointer)local_488) {
    operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  tgtNames.Base._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"JOB_POOL_LINK","");
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&tgtNames.Base,pcVar4,&build.Variables);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  cmCommonTargetGenerator::GetManifests(&tgtNames.Base,(cmCommonTargetGenerator *)this,config);
  _usedResponseFile = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"MANIFESTS","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&build.Variables,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar16,(string *)&tgtNames);
  if ((pointer)_usedResponseFile != (pointer)local_488) {
    operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&tgtNames.Base,&frameworkPath,&linkPath);
  _usedResponseFile = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&build.Variables,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar16,(string *)&tgtNames);
  if ((pointer)_usedResponseFile != (pointer)local_488) {
    operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  tgtNames.Base._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"CUDA","");
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar7,&langFlags,pcVar4,&tgtNames.Base,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  tgtNames.Base._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"LANGUAGE_COMPILE_FLAGS","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&build.Variables,&tgtNames.Base);
  std::__cxx11::string::_M_assign((string *)pmVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != paVar2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  TargetNames(&tgtNames,this,config);
  bVar21 = cmGeneratorTarget::HasSOName(pcVar4,config);
  if (bVar21) {
    this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)&usedResponseFile,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    __s = cmMakefile::GetSONameFlag(this_01,(string *)&usedResponseFile);
    local_438._0_8_ = local_438 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"SONAME_FLAG","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&build.Variables,(key_type *)local_438);
    pcVar15 = (char *)pmVar16->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar16,0,pcVar15,(ulong)__s);
    pcVar3 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_438 + 0x10);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_438._0_8_ != pcVar3) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    pcVar4 = local_408;
    if ((pointer)_usedResponseFile != (pointer)local_488) {
      operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
    }
    source_00._M_str = tgtNames.SharedObject._M_dataplus._M_p;
    source_00._M_len = tgtNames.SharedObject._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&usedResponseFile,(cmOutputConverter *)pcVar7,source_00,SHELL,false);
    local_438._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"SONAME","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&build.Variables,(key_type *)local_438);
    std::__cxx11::string::operator=((string *)pmVar16,(string *)&usedResponseFile);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_438._0_8_ != pcVar3) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    if ((pointer)_usedResponseFile != (pointer)local_488) {
      operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
    }
    TVar11 = cmGeneratorTarget::GetType(pcVar4);
    if (TVar11 == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)&usedResponseFile,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      if (pcStack_490 != (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
        source_01._M_str = _usedResponseFile;
        source_01._M_len = (size_t)pcStack_490;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)local_438,(cmOutputConverter *)pcVar7,source_01,SHELL,false);
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"INSTALLNAME_DIR","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&build.Variables,&objPath);
        std::__cxx11::string::operator=((string *)pmVar16,(string *)local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
        if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_438._0_8_ != pcVar3) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
      }
      if ((pointer)_usedResponseFile != (pointer)local_488) {
        operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
      }
    }
  }
  if (tgtNames.ImportLibrary._M_string_length != 0) {
    source_02._M_str = targetOutputImplib._M_dataplus._M_p;
    source_02._M_len = targetOutputImplib._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&usedResponseFile,(cmOutputConverter *)pcVar7,source_02,SHELL,false);
    local_438._0_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_438 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"TARGET_IMPLIB","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&build.Variables,(key_type *)local_438);
    std::__cxx11::string::_M_assign((string *)pmVar16);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_438._0_8_ !=
        (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,&targetOutputImplib);
    if ((pointer)_usedResponseFile != (pointer)local_488) {
      operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
    }
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)local_438,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  (*(gg->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
            (&local_3d8,gg,config);
  _usedResponseFile = (pointer)local_438._8_8_;
  pcStack_490 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_438._0_8_;
  local_488._8_8_ = local_3d8._M_string_length;
  local_478._M_allocated_capacity = (size_type)local_3d8._M_dataplus._M_p;
  views_01._M_len = 2;
  views_01._M_array = (iterator)&usedResponseFile;
  local_488._0_8_ = (string *)local_438;
  local_478._8_8_ = &local_3d8;
  cmCatViews(&objPath,views_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_438 + 0x10);
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_438._0_8_ != pcVar3) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar13 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar14 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar13,&objPath);
  source_03._M_str = (psVar14->_M_dataplus)._M_p;
  source_03._M_len = psVar14->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)&usedResponseFile,(cmOutputConverter *)pcVar7,source_03,SHELL,false);
  local_438._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"OBJECT_DIR","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&build.Variables,(key_type *)local_438);
  std::__cxx11::string::operator=((string *)pmVar16,(string *)&usedResponseFile);
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_438._0_8_ != pcVar3) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  if ((pointer)_usedResponseFile != (pointer)local_488) {
    operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
  }
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
            (&this->super_cmNinjaTargetGenerator,&build.Variables,config);
  _usedResponseFile = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_LIBRARIES","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&build.Variables,(key_type *)&usedResponseFile);
  if ((pointer)_usedResponseFile != (pointer)local_488) {
    operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
  }
  _usedResponseFile = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&build.Variables,(key_type *)&usedResponseFile);
  if ((pointer)_usedResponseFile != (pointer)local_488) {
    operator_delete(_usedResponseFile,(ulong)(local_488._0_8_ + 1));
  }
  if (gg->UsingGCCOnWindows == true) {
    sVar8 = pmVar16->_M_string_length;
    if (sVar8 != 0) {
      pcVar5 = (pmVar16->_M_dataplus)._M_p;
      sVar20 = 0;
      do {
        if (pcVar5[sVar20] == '\\') {
          pcVar5[sVar20] = '/';
        }
        sVar20 = sVar20 + 1;
      } while (sVar8 != sVar20);
    }
    sVar8 = pmVar17->_M_string_length;
    if (sVar8 != 0) {
      pcVar5 = (pmVar17->_M_dataplus)._M_p;
      sVar20 = 0;
      do {
        if (pcVar5[sVar20] == '\\') {
          pcVar5[sVar20] = '/';
        }
        sVar20 = sVar20 + 1;
      } while (sVar8 != sVar20);
    }
  }
  sVar18 = cmSystemTools::CalculateCommandLineLengthLimit();
  pmVar19 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&gg->RuleCmdLength,&build.Rule);
  iVar10 = *pmVar19;
  psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(local_408);
  iVar12 = (*(gg->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
             [0x28])();
  if ((char)iVar12 == '\0') {
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  }
  else {
    _usedResponseFile = (pointer)0x0;
    pcStack_490 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)&DAT_00000001;
    local_488._0_8_ = local_488 + 8;
    local_488[8] = 0x2e;
    local_438._0_8_ = &DAT_00000001;
    local_438._16_8_ = 0;
    local_418 = (config->_M_dataplus)._M_p;
    local_438._24_8_ = config->_M_string_length;
    local_410 = 0;
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_438;
    local_438._8_8_ = local_488._0_8_;
    cmCatViews(&local_238,views_02);
  }
  _usedResponseFile = (pointer)0xb;
  pcStack_490 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x973dca;
  local_488._0_8_ = (pointer)0x0;
  local_478._M_allocated_capacity = (size_type)(psVar14->_M_dataplus)._M_p;
  local_488._8_8_ = psVar14->_M_string_length;
  local_478._8_8_ = 0;
  local_458 = &local_238;
  local_468 = local_238._M_string_length;
  local_460 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p;
  local_450 = 4;
  local_448 = ".rsp";
  local_440 = 0;
  views_03._M_len = 4;
  views_03._M_array = (iterator)&usedResponseFile;
  cmCatViews(&local_3d8,views_03);
  pcVar13 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar13,&local_3d8);
  std::__cxx11::string::_M_assign((string *)&build.RspFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &build.OrderOnlyDeps,config,config,DependOnTargetArtifact);
  _usedResponseFile = _usedResponseFile & 0xffffffffffffff00;
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(gg,(ostream *)os,&build,(int)sVar18 - iVar10,&usedResponseFile)
  ;
  WriteNvidiaDeviceLinkRule(this,usedResponseFile,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorTarget::Names::~Names(&tgtNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
    operator_delete(langFlags._M_dataplus._M_p,
                    CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                             langFlags.field_2._M_local_buf[0]) + 1);
  }
  cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
            (&linkLineComputer.super_cmLinkLineDeviceComputer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)createRule._M_dataplus._M_p != &createRule.field_2) {
    operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  cmNinjaBuild::~cmNinjaBuild(&build);
LAB_00516f3d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputImplib._M_dataplus._M_p != &targetOutputImplib.field_2) {
    operator_delete(targetOutputImplib._M_dataplus._M_p,
                    targetOutputImplib.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement(
  const std::string& config, const std::string& fileConfig,
  const std::string& outputDir, const std::string& output)
{
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();

  std::string targetOutputImplib = this->ConvertToNinjaPath(
    genTarget->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));

  if (config != fileConfig) {
    std::string targetOutputFileConfigDir =
      cmStrCat(this->GetLocalGenerator()->GetTargetDirectory(genTarget),
               globalGen->ConfigDirectory(fileConfig), "/");
    targetOutputFileConfigDir =
      globalGen->ExpandCFGIntDir(outputDir, fileConfig);
    if (outputDir == targetOutputFileConfigDir) {
      return;
    }

    if (!genTarget->GetFullName(config, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        !genTarget
           ->GetFullName(fileConfig, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        targetOutputImplib ==
          this->ConvertToNinjaPath(genTarget->GetFullPath(
            fileConfig, cmStateEnums::ImportLibraryArtifact))) {
      return;
    }
  }

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule(config));
  build.Comment =
    cmStrCat("Link the ", this->GetVisibleTypeName(), ' ', output);

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(output);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects(config);
  build.ImplicitDeps =
    this->ComputeLinkDeps(this->TargetLinkLanguage(config), config);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    genTarget->GetCreateRuleVariable(this->TargetLinkLanguage(config), config);
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(output, cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    this->GetLocalGenerator(),
    this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  localGen.GetDeviceLinkFlags(linkLineComputer, config, vars["LINK_LIBRARIES"],
                              vars["LINK_FLAGS"], frameworkPath, linkPath,
                              genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["MANIFESTS"] = this->GetManifests(config);

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute language specific link flags.
  std::string langFlags;
  localGen.AddLanguageFlagsForLinking(langFlags, genTarget, "CUDA", config);
  vars["LANGUAGE_COMPILE_FLAGS"] = langFlags;

  auto const tgtNames = this->TargetNames(config);
  if (genTarget->HasSOName(config)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage(config));
    vars["SONAME"] = localGen.ConvertToOutputFormat(tgtNames.SharedObject,
                                                    cmOutputConverter::SHELL);
    if (genTarget->GetType() == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(config);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!tgtNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    this->EnsureParentDirectoryExists(targetOutputImplib);
  }

  const std::string objPath =
    cmStrCat(this->GetGeneratorTarget()->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  this->EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars, config);

  std::string& linkLibraries = vars["LINK_LIBRARIES"];
  std::string& link_path = vars["LINK_PATH"];
  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(build.Rule);

  build.RspFile = this->ConvertToNinjaPath(
    cmStrCat("CMakeFiles/", genTarget->GetName(),
             globalGen->IsMultiConfig() ? cmStrCat('.', config) : "", ".rsp"));

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(
    this->GetGeneratorTarget(), build.OrderOnlyDeps, config, config,
    DependOnTargetArtifact);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetCommonFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteNvidiaDeviceLinkRule(usedResponseFile, config);
}